

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O0

void Assimp::ExportScenePlyBinary
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  DeadlyImportError *this;
  pointer pIVar3;
  undefined8 uVar4;
  streamoff sVar5;
  fpos local_270 [16];
  string local_260 [38];
  undefined1 local_23a;
  allocator<char> local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_1e8;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> outfile;
  PlyExporter exporter;
  ExportProperties *param_3_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *pFile_local;
  
  PlyExporter::PlyExporter((PlyExporter *)&outfile,pFile,pScene,true);
  iVar2 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wb");
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_1e8,
             (pointer)CONCAT44(extraout_var,iVar2));
  bVar1 = std::operator==(&local_1e8,(nullptr_t)0x0);
  if (!bVar1) {
    pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_1e8);
    std::__cxx11::ostringstream::str();
    uVar4 = std::__cxx11::string::c_str();
    local_270 = (fpos  [16])std::ostream::tellp();
    sVar5 = std::fpos::operator_cast_to_long(local_270);
    (*pIVar3->_vptr_IOStream[3])(pIVar3,uVar4,sVar5,1);
    std::__cxx11::string::~string(local_260);
    std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
              (&local_1e8);
    PlyExporter::~PlyExporter((PlyExporter *)&outfile);
    return;
  }
  local_23a = 1;
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,pFile,&local_239);
  std::operator+(&local_218,"could not open output .ply file: ",&local_238);
  DeadlyImportError::DeadlyImportError(this,&local_218);
  local_23a = 0;
  __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void ExportScenePlyBinary(const char* pFile, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/)
{
    // invoke the exporter
    PlyExporter exporter(pFile, pScene, true);

    // we're still here - export successfully completed. Write the file.
    std::unique_ptr<IOStream> outfile(pIOSystem->Open(pFile, "wb"));
    if (outfile == NULL) {
        throw DeadlyExportError("could not open output .ply file: " + std::string(pFile));
    }

    outfile->Write(exporter.mOutput.str().c_str(), static_cast<size_t>(exporter.mOutput.tellp()), 1);
}